

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::anon_unknown_0::FractCaseInstance::getInputValues
          (FractCaseInstance *this,int numValues,void **values)

{
  uint uVar1;
  pointer pSVar2;
  deUint32 dVar3;
  int iVar4;
  Float<unsigned_int,_8,_23,_127,_3U> FVar5;
  void *pvVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  float minValue;
  float maxValue;
  float __tmp;
  float fVar12;
  float fVar13;
  Float<unsigned_short,_5,_10,_15,_3U> local_5a;
  float afStack_58 [8];
  Random rnd;
  
  afStack_58[2] = -1000.0;
  afStack_58[3] = 1000.0;
  afStack_58[4] = -1e+07;
  afStack_58[5] = 1e+07;
  dVar3 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  deRandom_init(&rnd.m_rnd,dVar3 ^ 0xac23f);
  pSVar2 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = *(uint *)((long)&(pSVar2->varType).m_data + 4);
  uVar11 = (ulong)uVar1;
  iVar4 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (uVar11 == 0) {
    pvVar6 = *values;
    iVar7 = 0;
    minValue = -2.0;
    maxValue = 2.0;
  }
  else {
    minValue = afStack_58[uVar11 * 2];
    maxValue = afStack_58[uVar11 * 2 + 1];
    pvVar6 = *values;
    iVar7 = 10;
    for (iVar8 = 0; iVar8 != 10; iVar8 = iVar8 + 1) {
      fVar12 = (float)iVar8 + -5.5;
      fVar13 = maxValue;
      if (fVar12 <= maxValue) {
        fVar13 = fVar12;
      }
      for (lVar9 = 0; (long)iVar4 * 4 != lVar9; lVar9 = lVar9 + 4) {
        *(uint *)((long)pvVar6 + lVar9) =
             -(uint)(fVar12 < minValue) & (uint)minValue |
             ~-(uint)(fVar12 < minValue) & (uint)fVar13;
      }
    }
  }
  fillRandomScalars<float>
            (&rnd,minValue,maxValue,(void *)((long)pvVar6 + (long)(iVar7 * iVar4) * 4),
             (numValues - iVar7) * iVar4,iVar7 * iVar4);
  if (uVar1 == 1) {
    uVar10 = 0;
    uVar11 = (ulong)(uint)(iVar4 * numValues);
    if (iVar4 * numValues < 1) {
      uVar11 = uVar10;
    }
    for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
                (&local_5a,*(float *)((long)*values + uVar10 * 4));
      FVar5 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_5a);
      *(StorageType *)((long)*values + uVar10 * 4) = FVar5.m_value;
    }
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd				(deStringHash(m_name) ^ 0xac23fu);
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		int						numSpecialCases	= 0;

		// Special cases.
		if (precision != glu::PRECISION_LOWP)
		{
			DE_ASSERT(numValues >= 10);
			for (int ndx = 0; ndx < 10; ndx++)
			{
				const float v = de::clamp(float(ndx) - 5.5f, ranges[precision].x(), ranges[precision].y());
				std::fill((float*)values[0], (float*)values[0] + scalarSize, v);
				numSpecialCases += 1;
			}
		}

		// Random cases.
		fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), (float*)values[0] + numSpecialCases*scalarSize, (numValues-numSpecialCases)*scalarSize);

		// If precision is mediump, make sure values can be represented in fp16 exactly
		if (precision == glu::PRECISION_MEDIUMP)
		{
			for (int ndx = 0; ndx < numValues*scalarSize; ndx++)
				((float*)values[0])[ndx] = tcu::Float16(((float*)values[0])[ndx]).asFloat();
		}
	}